

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Scope *this_00;
  VariableSym *symbol;
  Value *pVVar1;
  undefined4 in_register_00000034;
  allocator<char> local_41;
  string local_40;
  Value *local_20;
  Value *var;
  VariableExpr *expr_local;
  IRGenerator *this_local;
  
  var = (Value *)CONCAT44(in_register_00000034,__fd);
  expr_local = (VariableExpr *)this;
  this_00 = scope(this);
  symbol = VariableExpr::variable((VariableExpr *)var);
  pVVar1 = Scope::lookup(this_00,&symbol->super_Symbol);
  if (pVVar1 == (Value *)0x0) {
    this->result_ = (Value *)0x0;
  }
  else {
    local_20 = pVVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    pVVar1 = IRBuilder::createLoad(&this->super_IRBuilder,pVVar1,&local_40);
    this->result_ = pVVar1;
    std::__cxx11::string::~string((string *)&local_40);
    this = (IRGenerator *)std::allocator<char>::~allocator(&local_41);
  }
  return (int)this;
}

Assistant:

void IRGenerator::accept(VariableExpr& expr) {
  // loads the value of the given variable

  if (auto var = scope().lookup(expr.variable())) {
    result_ = createLoad(var);
  } else {
    result_ = nullptr;
  }
}